

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCountedObjectImpl.hpp
# Opt level: O3

void __thiscall
Diligent::RefCountersImpl::
ObjectWrapper<Diligent::SerializedShaderImpl,_Diligent::FixedBlockMemoryAllocator>::DestroyObject
          (ObjectWrapper<Diligent::SerializedShaderImpl,_Diligent::FixedBlockMemoryAllocator> *this)

{
  SerializedShaderImpl *this_00;
  
  this_00 = this->m_pObject;
  if (this->m_pAllocator != (FixedBlockMemoryAllocator *)0x0) {
    SerializedShaderImpl::~SerializedShaderImpl(this_00);
    FixedBlockMemoryAllocator::Free(this->m_pAllocator,this->m_pObject);
    return;
  }
  if (this_00 != (SerializedShaderImpl *)0x0) {
    SerializedShaderImpl::~SerializedShaderImpl(this_00);
    free(this_00);
    return;
  }
  return;
}

Assistant:

virtual void DestroyObject() override final
        {
            if (m_pAllocator)
            {
                m_pObject->~ObjectType();
                m_pAllocator->Free(m_pObject);
            }
            else
            {
                delete m_pObject;
            }
        }